

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strutil.h
# Opt level: O1

string * __thiscall
google::protobuf::Join<std::vector<int,std::allocator<int>>>
          (string *__return_storage_ptr__,protobuf *this,
          vector<int,_std::allocator<int>_> *components,char *delim)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  Join<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>
            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)*(int **)this,
             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>)
             *(int **)(this + 8),(char *)components,__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

string Join(const Range& components,
            const char* delim) {
  string result;
  Join(components.begin(), components.end(), delim, &result);
  return result;
}